

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O2

ze_result_t zesGetStandbyProcAddrTable(ze_api_version_t version,zes_standby_dditable_t *pDdiTable)

{
  undefined8 *puVar1;
  long lVar2;
  zes_pfnStandbyGetMode_t p_Var3;
  int iVar4;
  ze_result_t zVar5;
  code *UNRECOVERED_JUMPTABLE;
  long lVar6;
  iterator __begin1;
  undefined8 *puVar7;
  bool bVar8;
  
  puVar7 = (undefined8 *)**(long **)(loader::context + 0x1610);
  puVar1 = (undefined8 *)(*(long **)(loader::context + 0x1610))[1];
  if (puVar1 != puVar7) {
    if (pDdiTable == (zes_standby_dditable_t *)0x0) {
      return ZE_RESULT_ERROR_INVALID_NULL_POINTER;
    }
    if (*(int *)(loader::context + 0x15c0) < (int)version) {
      return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
    }
    bVar8 = false;
    for (; puVar7 != puVar1; puVar7 = puVar7 + 0x1b3) {
      if ((*(int *)(puVar7 + 1) == 0) &&
         (UNRECOVERED_JUMPTABLE = (code *)dlsym(*puVar7,"zesGetStandbyProcAddrTable"),
         UNRECOVERED_JUMPTABLE != (code *)0x0)) {
        iVar4 = (*UNRECOVERED_JUMPTABLE)(version,puVar7 + 0x172);
        if (iVar4 == 0) {
          bVar8 = true;
        }
        else {
          *(int *)(puVar7 + 1) = iVar4;
        }
      }
    }
    if (bVar8) {
      lVar2 = **(long **)(loader::context + 0x1610);
      lVar6 = (*(long **)(loader::context + 0x1610))[1] - lVar2;
      if (((ulong)(lVar6 / 0xd98) < 2) && (*(char *)(loader::context + 0x1629) != '\x01')) {
        pDdiTable->pfnSetMode = *(zes_pfnStandbySetMode_t *)(lVar2 + 0xba0);
        p_Var3 = *(zes_pfnStandbyGetMode_t *)(lVar2 + 0xb98);
        pDdiTable->pfnGetProperties = *(zes_pfnStandbyGetProperties_t *)(lVar2 + 0xb90);
        pDdiTable->pfnGetMode = p_Var3;
      }
      else {
        pDdiTable->pfnGetProperties = loader::zesStandbyGetProperties;
        pDdiTable->pfnGetMode = loader::zesStandbyGetMode;
        pDdiTable->pfnSetMode = loader::zesStandbySetMode;
      }
      if (*(long *)(loader::context + 0x1618) != 0) {
        UNRECOVERED_JUMPTABLE =
             (code *)dlsym(*(long *)(loader::context + 0x1618),"zesGetStandbyProcAddrTable",
                           lVar6 % 0xd98);
        if (UNRECOVERED_JUMPTABLE == (code *)0x0) {
          return ZE_RESULT_ERROR_UNINITIALIZED;
        }
        zVar5 = (*UNRECOVERED_JUMPTABLE)(version,pDdiTable);
        return zVar5;
      }
      return ZE_RESULT_SUCCESS;
    }
  }
  return ZE_RESULT_ERROR_UNINITIALIZED;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zesGetStandbyProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    zes_standby_dditable_t* pDdiTable               ///< [in,out] pointer to table of DDI function pointers
    )
{
    if( loader::context->sysmanInstanceDrivers->size() < 1 ) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if( loader::context->version < version )
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    bool atLeastOneDriverValid = false;
    // Load the device-driver DDI tables
    for( auto& drv : *loader::context->sysmanInstanceDrivers )
    {
        if(drv.initStatus != ZE_RESULT_SUCCESS)
            continue;
        auto getTable = reinterpret_cast<zes_pfnGetStandbyProcAddrTable_t>(
            GET_FUNCTION_PTR( drv.handle, "zesGetStandbyProcAddrTable") );
        if(!getTable) 
            continue; 
        auto getTableResult = getTable( version, &drv.dditable.zes.Standby);
        if(getTableResult == ZE_RESULT_SUCCESS) 
            atLeastOneDriverValid = true;
        else
            drv.initStatus = getTableResult;
    }

    if(!atLeastOneDriverValid)
        result = ZE_RESULT_ERROR_UNINITIALIZED;
    else
        result = ZE_RESULT_SUCCESS;

    if( ZE_RESULT_SUCCESS == result )
    {
        if( ( loader::context->sysmanInstanceDrivers->size() > 1 ) || loader::context->forceIntercept )
        {
            // return pointers to loader's DDIs
            pDdiTable->pfnGetProperties                            = loader::zesStandbyGetProperties;
            pDdiTable->pfnGetMode                                  = loader::zesStandbyGetMode;
            pDdiTable->pfnSetMode                                  = loader::zesStandbySetMode;
        }
        else
        {
            // return pointers directly to driver's DDIs
            *pDdiTable = loader::context->sysmanInstanceDrivers->front().dditable.zes.Standby;
        }
    }

    // If the validation layer is enabled, then intercept the loader's DDIs
    if(( ZE_RESULT_SUCCESS == result ) && ( nullptr != loader::context->validationLayer ))
    {
        auto getTable = reinterpret_cast<zes_pfnGetStandbyProcAddrTable_t>(
            GET_FUNCTION_PTR(loader::context->validationLayer, "zesGetStandbyProcAddrTable") );
        if(!getTable)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        result = getTable( version, pDdiTable );
    }

    return result;
}